

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O1

spv_result_t spvtools::val::anon_unknown_1::VersionCheck(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  spv_result_t sVar5;
  DiagnosticStream *pDVar6;
  ExtensionSet *extensions;
  ExtensionSet *extensions_00;
  Extension *value;
  Op opcode;
  ulong uVar7;
  ExtensionSet exts;
  spv_opcode_desc inst_desc;
  EnumSet<spvtools::Extension> local_258;
  string local_238;
  char *local_218;
  spv_opcode_desc local_210;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  opcode = (Op)uVar1;
  sVar5 = AssemblyGrammar::lookupOpcode(&_->grammar_,(uint)uVar1,&local_210);
  if (sVar5 != SPV_SUCCESS) {
    __assert_fail("r == SPV_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_instruction.cpp"
                  ,0x119,
                  "spv_result_t spvtools::val::(anonymous namespace)::VersionCheck(ValidationState_t &, const Instruction *)"
                 );
  }
  uVar2 = _->version_;
  if (local_210->lastVersion < uVar2) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_WRONG_VERSION,inst);
    local_258.buckets_.
    super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)spvOpcodeString((uint)uVar1);
    pDVar6 = DiagnosticStream::operator<<(&local_208,(char **)&local_258);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar6," requires SPIR-V version ",0x19);
    std::ostream::_M_insert<unsigned_long>((ulong)pDVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar6,".",1);
    std::ostream::_M_insert<unsigned_long>((ulong)pDVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar6," or earlier",0xb);
    sVar5 = pDVar6->error_;
    DiagnosticStream::~DiagnosticStream(&local_208);
    return sVar5;
  }
  uVar3 = local_210->minVersion;
  if (((inst->inst_).opcode != 0x1140) && (local_210->numCapabilities != 0)) {
    return SPV_SUCCESS;
  }
  uVar7 = (ulong)local_210->numExtensions;
  value = local_210->extensions;
  local_258.buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.size_ = 0;
  local_258.buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (uVar7 != 0) {
    do {
      EnumSet<spvtools::Extension>::insert
                ((pair<spvtools::EnumSet<spvtools::Extension>::Iterator,_bool> *)&local_208,
                 &local_258,value);
      value = value + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  if (local_258.size_ == 0) {
    if (uVar3 == 0xffffffff) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_WRONG_VERSION,inst);
      local_238._M_dataplus._M_p = spvOpcodeString(opcode);
      pDVar6 = DiagnosticStream::operator<<(&local_208,(char **)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar6," is reserved for future use.",0x1c);
      sVar5 = pDVar6->error_;
    }
    else {
      sVar5 = SPV_SUCCESS;
      if (uVar3 <= uVar2) goto LAB_001f5c9a;
      ValidationState_t::diag(&local_208,_,SPV_ERROR_WRONG_VERSION,inst);
      local_238._M_dataplus._M_p = spvOpcodeString(opcode);
      pDVar6 = DiagnosticStream::operator<<(&local_208,(char **)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar6," requires SPIR-V version ",0x19);
      std::ostream::_M_insert<unsigned_long>((ulong)pDVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar6,".",1);
      std::ostream::_M_insert<unsigned_long>((ulong)pDVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar6," at minimum.",0xc);
      sVar5 = pDVar6->error_;
    }
  }
  else {
    bVar4 = ValidationState_t::HasAnyOfExtensions(_,&local_258);
    sVar5 = SPV_SUCCESS;
    if (bVar4) goto LAB_001f5c9a;
    if (uVar3 == 0xffffffff) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_MISSING_EXTENSION,inst);
      local_218 = spvOpcodeString(opcode);
      pDVar6 = DiagnosticStream::operator<<(&local_208,&local_218);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar6," requires one of the following extensions: ",0x2b);
      ExtensionSetToString_abi_cxx11_(&local_238,(spvtools *)&local_258,extensions_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar6,local_238._M_dataplus._M_p,local_238._M_string_length);
      sVar5 = pDVar6->error_;
    }
    else {
      if (uVar3 <= uVar2) goto LAB_001f5c9a;
      ValidationState_t::diag(&local_208,_,SPV_ERROR_WRONG_VERSION,inst);
      local_218 = spvOpcodeString(opcode);
      pDVar6 = DiagnosticStream::operator<<(&local_208,&local_218);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar6," requires SPIR-V version ",0x19);
      std::ostream::_M_insert<unsigned_long>((ulong)pDVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar6,".",1);
      std::ostream::_M_insert<unsigned_long>((ulong)pDVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar6," at minimum or one of the following extensions: ",0x30);
      ExtensionSetToString_abi_cxx11_(&local_238,(spvtools *)&local_258,extensions);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar6,local_238._M_dataplus._M_p,local_238._M_string_length);
      sVar5 = pDVar6->error_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
LAB_001f5c9a:
  if (local_258.buckets_.
      super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.buckets_.
                    super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.buckets_.
                          super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.buckets_.
                          super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return sVar5;
}

Assistant:

spv_result_t VersionCheck(ValidationState_t& _, const Instruction* inst) {
  const auto opcode = inst->opcode();
  spv_opcode_desc inst_desc;
  const spv_result_t r = _.grammar().lookupOpcode(opcode, &inst_desc);
  assert(r == SPV_SUCCESS);
  (void)r;

  const auto min_version = inst_desc->minVersion;
  const auto last_version = inst_desc->lastVersion;
  const auto module_version = _.version();

  if (last_version < module_version) {
    return _.diag(SPV_ERROR_WRONG_VERSION, inst)
           << spvOpcodeString(opcode) << " requires SPIR-V version "
           << SPV_SPIRV_VERSION_MAJOR_PART(last_version) << "."
           << SPV_SPIRV_VERSION_MINOR_PART(last_version) << " or earlier";
  }

  // OpTerminateInvocation is special because it is enabled by Shader
  // capability, but also requires an extension and/or version check.
  const bool capability_check_is_sufficient =
      inst->opcode() != spv::Op::OpTerminateInvocation;

  if (capability_check_is_sufficient && (inst_desc->numCapabilities > 0u)) {
    // We already checked that the direct capability dependency has been
    // satisfied. We don't need to check any further.
    return SPV_SUCCESS;
  }

  ExtensionSet exts(inst_desc->numExtensions, inst_desc->extensions);
  if (exts.empty()) {
    // If no extensions can enable this instruction, then emit error
    // messages only concerning core SPIR-V versions if errors happen.
    if (min_version == ~0u) {
      return _.diag(SPV_ERROR_WRONG_VERSION, inst)
             << spvOpcodeString(opcode) << " is reserved for future use.";
    }

    if (module_version < min_version) {
      return _.diag(SPV_ERROR_WRONG_VERSION, inst)
             << spvOpcodeString(opcode) << " requires SPIR-V version "
             << SPV_SPIRV_VERSION_MAJOR_PART(min_version) << "."
             << SPV_SPIRV_VERSION_MINOR_PART(min_version) << " at minimum.";
    }
  } else if (!_.HasAnyOfExtensions(exts)) {
    // Otherwise, we only error out when no enabling extensions are
    // registered.
    if (min_version == ~0u) {
      return _.diag(SPV_ERROR_MISSING_EXTENSION, inst)
             << spvOpcodeString(opcode)
             << " requires one of the following extensions: "
             << ExtensionSetToString(exts);
    }

    if (module_version < min_version) {
      return _.diag(SPV_ERROR_WRONG_VERSION, inst)
             << spvOpcodeString(opcode) << " requires SPIR-V version "
             << SPV_SPIRV_VERSION_MAJOR_PART(min_version) << "."
             << SPV_SPIRV_VERSION_MINOR_PART(min_version)
             << " at minimum or one of the following extensions: "
             << ExtensionSetToString(exts);
    }
  }

  return SPV_SUCCESS;
}